

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  string *psVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  size_type sVar6;
  bool bVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  _Base_ptr p_Var11;
  ulong uVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  uint minor;
  uint major;
  string dir;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  Name *local_78;
  string local_70;
  _Rb_tree_node_base *local_50;
  string *local_48;
  string *local_40;
  RegularExpression *local_38;
  
  if (name->TryRaw == true) {
    psVar1 = &this->TestPath;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(name->Raw)._M_dataplus._M_p);
    bVar7 = cmsys::SystemTools::FileExists((this->TestPath)._M_dataplus._M_p,true);
    if (bVar7) {
      cmsys::SystemTools::CollapseFullPath(&local_70,psVar1);
      std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(&this->BestPath);
      return true;
    }
  }
  local_80 = (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + path->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
  local_78 = name;
  local_40 = path;
  psVar8 = cmGlobalGenerator::GetDirectoryContent(this->GG,&local_70,true);
  p_Var11 = (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 != p_Var13) {
    local_80 = (long)local_80 >> 5;
    local_88 = (long)local_88 >> 5;
    local_38 = &local_78->Regex;
    psVar1 = &this->TestPath;
    local_48 = (string *)&this->BestPath;
    local_8c = 0;
    local_90 = 0;
    local_50 = p_Var13;
    do {
      bVar7 = cmsys::RegularExpression::find(local_38,*(char **)(p_Var11 + 1));
      if (bVar7) {
        std::__cxx11::string::_M_assign((string *)psVar1);
        std::__cxx11::string::_M_append((char *)psVar1,*(ulong *)(p_Var11 + 1));
        bVar7 = cmsys::SystemTools::FileIsDirectory(psVar1);
        if (!bVar7) {
          pcVar3 = (local_78->Regex).startp[1];
          if (pcVar3 == (char *)0x0) {
            local_b8 = &local_a8;
            local_b0 = 0;
            local_a8 = 0;
          }
          else {
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,pcVar3,(local_78->Regex).endp[1]);
          }
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->Prefixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->Prefixes).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          pbVar4 = (this->Prefixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          pcVar3 = (local_78->Regex).startp[2];
          if (pcVar3 == (char *)0x0) {
            local_b8 = &local_a8;
            local_b0 = 0;
            local_a8 = 0;
          }
          else {
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,pcVar3,(local_78->Regex).endp[2]);
          }
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             ((this->Suffixes).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->Suffixes).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          pbVar5 = (this->Suffixes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          local_94 = 0;
          local_98 = 0;
          if (this->OpenBSD == true) {
            pcVar3 = (local_78->Regex).startp[3];
            if (pcVar3 == (char *)0x0) {
              local_b8 = &local_a8;
              local_b0 = 0;
              local_a8 = 0;
            }
            else {
              local_b8 = &local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,pcVar3,(local_78->Regex).endp[3]);
            }
            __isoc99_sscanf(local_b8,".%u.%u",&local_94,&local_98);
            p_Var13 = local_50;
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
              p_Var13 = local_50;
            }
          }
          uVar14 = (long)_Var9._M_current - (long)pbVar4 >> 5;
          uVar12 = (long)_Var10._M_current - (long)pbVar5 >> 5;
          if (((((this->BestPath)._M_string_length == 0) || (uVar14 < local_80)) ||
              ((uVar14 == local_80 && (uVar12 < local_88)))) ||
             (((uVar14 == local_80 && (uVar12 == local_88)) &&
              ((local_8c < local_94 || ((local_94 == local_8c && (local_90 < local_98)))))))) {
            std::__cxx11::string::_M_assign(local_48);
            local_8c = local_94;
            local_90 = local_98;
            local_88 = uVar12;
            local_80 = uVar14;
          }
        }
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var13);
  }
  sVar6 = (this->BestPath)._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return sVar6 != 0;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = path;
    this->TestPath += name.Raw;
    if (cmSystemTools::FileExists(this->TestPath.c_str(), true)) {
      this->BestPath = cmSystemTools::CollapseFullPath(this->TestPath);
      cmSystemTools::ConvertToUnixSlashes(this->BestPath);
      return true;
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::set<std::string>::const_iterator fi = files.begin();
       fi != files.end(); ++fi) {
    std::string const& origName = *fi;
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = path;
      this->TestPath += origName;
      if (!cmSystemTools::FileIsDirectory(this->TestPath)) {
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->OpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}